

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void HistogramStatsClear(VP8LHistogram *h)

{
  long lVar1;
  
  for (lVar1 = -5; lVar1 != 0; lVar1 = lVar1 + 1) {
    h->trivial_symbol[lVar1 + 5] = 0xffff;
    h->is_used[lVar1 + 5] = '\x01';
  }
  h->costs[3] = 0;
  h->costs[4] = 0;
  h->costs[1] = 0;
  h->costs[2] = 0;
  h->bit_cost = 0;
  h->costs[0] = 0;
  return;
}

Assistant:

static void HistogramStatsClear(VP8LHistogram* const h) {
  int i;
  for (i = 0; i < 5; ++i) {
    h->trivial_symbol[i] = VP8L_NON_TRIVIAL_SYM;
    // By default, the histogram is assumed to be used.
    h->is_used[i] = 1;
  }
  h->bit_cost = 0;
  memset(h->costs, 0, sizeof(h->costs));
}